

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatRead.c
# Opt level: O3

int Msat_ReadInt(char **pIn)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  ulong uVar6;
  
  pbVar4 = (byte *)*pIn;
  while ((bVar1 = *pbVar4, bVar1 - 9 < 5 || (bVar1 == 0x20))) {
    pbVar4 = pbVar4 + 1;
    *pIn = (char *)pbVar4;
  }
  if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
    pbVar4 = pbVar4 + 1;
    *pIn = (char *)pbVar4;
  }
  bVar2 = *pbVar4;
  if (0xf5 < (byte)(bVar2 - 0x3a)) {
    iVar5 = 0;
    do {
      pbVar4 = pbVar4 + 1;
      iVar5 = (uint)(byte)(bVar2 - 0x30) + iVar5 * 10;
      *pIn = (char *)pbVar4;
      bVar2 = *pbVar4;
    } while ((byte)(bVar2 - 0x30) < 10);
    iVar3 = -iVar5;
    if (bVar1 != 0x2d) {
      iVar3 = iVar5;
    }
    return iVar3;
  }
  uVar6 = (ulong)bVar2;
  Msat_ReadInt_cold_1();
  return *(int *)(uVar6 + 0x60);
}

Assistant:

static int Msat_ReadInt( char ** pIn ) 
{
    int     val = 0;
    int     neg = 0;

    Msat_ReadWhitespace( pIn );
    if ( **pIn == '-' ) 
        neg = 1, 
        (*pIn)++;
    else if ( **pIn == '+' ) 
        (*pIn)++;
    if ( **pIn < '0' || **pIn > '9' ) 
        fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", **pIn), 
        exit(1);
    while ( **pIn >= '0' && **pIn <= '9' )
        val = val*10 + (**pIn - '0'),
        (*pIn)++;
    return neg ? -val : val; 
}